

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::CylindricalMapping2D::ToString_abi_cxx11_(CylindricalMapping2D *this)

{
  string *in_RDI;
  Transform *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::Transform_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string CylindricalMapping2D::ToString() const {
    return StringPrintf("[ CylindricalMapping2D textureFromRender: %s ]",
                        textureFromRender);
}